

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZMaterialData *data)

{
  int *piVar1;
  pair<int,_long> *ppVar2;
  bool bVar3;
  int iVar4;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  int i;
  ulong uVar9;
  long lVar10;
  TPZManVector<long,_2> ids;
  TPZVec<int> local_b8;
  int aiStack_98 [2];
  TPZVec<int> local_90;
  int aiStack_70 [4];
  TPZVec<long> local_60;
  long local_40 [2];
  
  TPZVec<long>::TPZVec(&local_60,0);
  local_60._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181b7f8;
  local_60.fStore = local_40;
  local_60.fNElements = 2;
  local_60.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_90,0);
  local_90.fStore = aiStack_70;
  local_90._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_90.fNElements = 3;
  local_90.fNAlloc = 0;
  aiStack_70[0] = 0;
  aiStack_70[1] = 0;
  aiStack_70[2] = 0;
  TPZVec<int>::TPZVec(&local_b8,0);
  local_b8.fStore = aiStack_98;
  local_b8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c8e8;
  local_b8.fNElements = 2;
  local_b8.fNAlloc = 0;
  aiStack_98[0] = 0;
  aiStack_98[1] = 0;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar8 = 0;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    pTVar5 = TPZGeoEl::NodePtr(this_00,(int)lVar8);
    local_60.fStore[lVar8] = (long)pTVar5->fId;
    lVar8 = 1;
    bVar3 = false;
  } while (bVar6);
  uVar9 = 0;
  do {
    lVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar9 & 0xffffffff);
    local_90.fStore[uVar9] = (uint)*(byte *)(lVar8 + 0x14);
    uVar9 = uVar9 + 1;
  } while (uVar9 != 3);
  piVar1 = (this->fSideOrient).super_TPZVec<int>.fStore;
  *local_b8.fStore = *piVar1;
  local_b8.fStore[1] = piVar1[1];
  if (this->fhdivfam == EHDivStandard) {
    TPZShapeHDiv<pzshape::TPZShapeLinear>::Initialize
              (&local_60,&local_90,&local_b8,&data->super_TPZShapeData);
    iVar4 = TPZShapeHDiv<pzshape::TPZShapeLinear>::NShapeF(&data->super_TPZShapeData);
  }
  else {
    iVar4 = 0;
    if (this->fhdivfam == EHDivConstant) {
      TPZShapeHDivConstant<pzshape::TPZShapeLinear>::Initialize
                (&local_60,&local_90,&local_b8,&data->super_TPZShapeData);
      iVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 600))(this);
    }
  }
  lVar8 = (long)iVar4;
  TPZFMatrix<double>::Resize(&(data->phi).super_TPZFMatrix<double>,lVar8,1);
  TPZManVector<std::pair<int,_long>,_20>::Resize(&data->fVecShapeIndex,lVar8);
  if (0 < iVar4) {
    lVar7 = 8;
    lVar10 = 0;
    do {
      if (((data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar10) ||
         ((data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (data->phi).super_TPZFMatrix<double>.fElem[lVar10] = 1.0;
      ppVar2 = (data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
      *(int *)((long)ppVar2 + lVar7 + -8) = (int)lVar10;
      *(long *)((long)&ppVar2->first + lVar7) = lVar10;
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 != lVar10);
  }
  (data->super_TPZShapeData).fShapeType = EVecShape;
  if (local_b8.fStore != aiStack_98) {
    local_b8.fNAlloc = 0;
    local_b8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_b8.fStore != (int *)0x0) {
      operator_delete__(local_b8.fStore);
    }
  }
  if (local_90.fStore != aiStack_70) {
    local_90.fNAlloc = 0;
    local_90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_90.fStore != (int *)0x0) {
      operator_delete__(local_90.fStore);
    }
  }
  if (local_60.fStore != local_40) {
    local_60.fNAlloc = 0;
    local_60._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_60.fStore != (long *)0x0) {
      operator_delete__(local_60.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}